

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# part_file.cpp
# Opt level: O0

ssize_t __thiscall
libtorrent::aux::part_file::read(part_file *this,int __fd,void *__buf,size_t __nbytes)

{
  bool bVar1;
  uint uVar2;
  pointer ppVar3;
  int64_t iVar4;
  undefined4 in_register_00000034;
  int in_R8D;
  error_code *in_R9;
  error_code *ec;
  error_code eVar5;
  span<char> buf;
  span<char> local_a8;
  undefined4 local_98;
  undefined4 local_94;
  uint local_90;
  undefined1 local_8c [8];
  file_handle f;
  slot_index_t slot;
  undefined8 local_78;
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_70 [3];
  _Node_iterator_base<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_true>
  local_58;
  iterator i;
  unique_lock<std::mutex> l;
  error_code *ec_local;
  int offset_local;
  part_file *this_local;
  undefined1 auStack_20 [4];
  piece_index_t piece_local;
  span<char> buf_local;
  
  _auStack_20 = (char *)CONCAT44(in_register_00000034,__fd);
  this_local._4_4_ = (undefined4)__nbytes;
  ec = in_R9;
  ::std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&i,&this->m_mutex);
  local_58._M_cur =
       (__node_type *)
       ::std::
       unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
       ::find(&this->m_piece_map,(key_type *)((long)&this_local + 4));
  local_70[0]._M_cur =
       (__node_type *)
       ::std::
       unordered_map<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>,_std::hash<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::equal_to<libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>_>,_std::allocator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>_>_>
       ::end(&this->m_piece_map);
  bVar1 = ::std::__detail::operator==(&local_58,local_70);
  if (bVar1) {
    eVar5 = boost::system::errc::make_error_code(no_such_file_or_directory);
    _slot = eVar5._0_8_;
    *(undefined8 *)in_R9 = _slot;
    local_78 = eVar5.cat_;
    in_R9->cat_ = (error_category *)local_78;
    buf_local.m_len._4_4_ = 0xffffffff;
    f.m_fd = 1;
  }
  else {
    ppVar3 = ::std::__detail::
             _Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
             ::operator->((_Node_iterator<std::pair<const_libtorrent::aux::strong_typedef<int,_libtorrent::aux::piece_index_tag,_void>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::slot_index_tag_t,_void>_>,_false,_true>
                           *)&local_58);
    local_8c._4_4_ = (ppVar3->second).m_val;
    ::std::unique_lock<std::mutex>::unlock((unique_lock<std::mutex> *)&i);
    local_94 = 0;
    local_98 = 0x20;
    local_90 = (uint)libtorrent::flags::operator|
                               ((bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>)
                                0x0,(bitfield_flag<unsigned_int,_libtorrent::aux::open_mode_tag,_void>
                                     )0x20);
    open_file((part_file *)local_8c,(open_mode_t)(uint)this,(error_code *)(ulong)local_90);
    bVar1 = boost::system::error_code::operator_cast_to_bool(in_R9);
    if (bVar1) {
      buf_local.m_len._4_4_ = 0xffffffff;
    }
    else {
      uVar2 = file_handle::fd((file_handle *)local_8c);
      span<char>::span<libtorrent::span<char>,char,void>(&local_a8,(span<char> *)auStack_20);
      iVar4 = slot_offset(this,(slot_index_t)local_8c._4_4_);
      buf.m_len = iVar4 + in_R8D;
      buf.m_ptr = (char *)local_a8.m_len;
      buf_local.m_len._4_4_ =
           pread_all((aux *)(ulong)uVar2,(handle_type)local_a8.m_ptr,buf,(int64_t)in_R9,ec);
    }
    f.m_fd = 1;
    file_handle::~file_handle((file_handle *)local_8c);
  }
  ::std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&i);
  return (ulong)buf_local.m_len._4_4_;
}

Assistant:

int part_file::read(span<char> buf
		, piece_index_t const piece
		, int const offset, error_code& ec)
	{
		TORRENT_ASSERT(offset >= 0);
		TORRENT_ASSERT(int(buf.size()) + offset <= m_piece_size);
		std::unique_lock<std::mutex> l(m_mutex);

		auto const i = m_piece_map.find(piece);
		if (i == m_piece_map.end())
		{
			ec = make_error_code(boost::system::errc::no_such_file_or_directory);
			return -1;
		}

		slot_index_t const slot = i->second;
		l.unlock();

		auto f = open_file(aux::open_mode::read_only | aux::open_mode::hidden, ec);
		if (ec) return -1;

		return int(aux::pread_all(f.fd(), buf, slot_offset(slot) + offset, ec));
	}